

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

int32_t __thiscall
icu_63::BurmeseBreakEngine::divideUpDictionaryRange
          (BurmeseBreakEngine *this,UText *text,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  UBool UVar1;
  UChar32 UVar2;
  int iVar3;
  UChar32 c;
  int32_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  bool bVar7;
  PossibleWord *local_3a0;
  PossibleWord *local_2b0;
  int32_t currPos;
  int32_t num_candidates;
  int32_t pcSize;
  int32_t pcIndex;
  int32_t chars;
  UChar32 uc;
  UChar32 pc;
  int32_t remaining;
  int32_t wordsMatched;
  int32_t candidates;
  undefined1 local_268 [8];
  PossibleWord words [3];
  UErrorCode local_44;
  int local_40;
  UErrorCode status;
  int32_t current;
  int32_t cuWordLength;
  int32_t cpWordLength;
  uint32_t wordsFound;
  UVector32 *foundBreaks_local;
  int32_t rangeEnd_local;
  int32_t rangeStart_local;
  UText *text_local;
  BurmeseBreakEngine *this_local;
  
  if (rangeEnd - rangeStart < 4) {
    this_local._4_4_ = 0;
  }
  else {
    cuWordLength = 0;
    current = 0;
    status = U_ZERO_ERROR;
    local_44 = U_ZERO_ERROR;
    local_2b0 = (PossibleWord *)local_268;
    _cpWordLength = foundBreaks;
    foundBreaks_local._0_4_ = rangeEnd;
    foundBreaks_local._4_4_ = rangeStart;
    _rangeEnd_local = text;
    text_local = (UText *)this;
    do {
      PossibleWord::PossibleWord(local_2b0);
      local_2b0 = local_2b0 + 1;
    } while (local_2b0 != (PossibleWord *)(words[2].cpLengths + 0x12));
    utext_setNativeIndex_63(_rangeEnd_local,(long)foundBreaks_local._4_4_);
    while( true ) {
      UVar1 = ::U_SUCCESS(local_44);
      bVar7 = false;
      if (UVar1 != '\0') {
        iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
        local_40 = (int)iVar5;
        bVar7 = local_40 < (int32_t)foundBreaks_local;
      }
      if (!bVar7) break;
      status = U_ZERO_ERROR;
      current = 0;
      iVar4 = PossibleWord::candidates
                        ((PossibleWord *)
                         (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                         _rangeEnd_local,this->fDictionary,(int32_t)foundBreaks_local);
      if (iVar4 == 1) {
        status = PossibleWord::acceptMarked
                           ((PossibleWord *)
                            (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                            _rangeEnd_local);
        current = PossibleWord::markedCPLength
                            ((PossibleWord *)
                             (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
        cuWordLength = cuWordLength + 1;
      }
      else if (1 < iVar4) {
        iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
        if (iVar5 < (int32_t)foundBreaks_local) {
          do {
            iVar4 = PossibleWord::candidates
                              ((PossibleWord *)
                               (words[(ulong)(cuWordLength + 1 + ((cuWordLength + 1U) / 3) * -3) - 1
                                     ].cpLengths + 0x12),_rangeEnd_local,this->fDictionary,
                               (int32_t)foundBreaks_local);
            if (0 < iVar4) {
              PossibleWord::markCurrent
                        ((PossibleWord *)
                         (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
              iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
              if ((int32_t)foundBreaks_local <= (int)iVar5) break;
              do {
                iVar4 = PossibleWord::candidates
                                  ((PossibleWord *)
                                   (words[(ulong)(cuWordLength + 2 + ((cuWordLength + 2U) / 3) * -3)
                                          - 1].cpLengths + 0x12),_rangeEnd_local,this->fDictionary,
                                   (int32_t)foundBreaks_local);
                if (iVar4 != 0) {
                  PossibleWord::markCurrent
                            ((PossibleWord *)
                             (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
                  goto LAB_0040ee21;
                }
                UVar1 = PossibleWord::backUp
                                  ((PossibleWord *)
                                   (words[(ulong)(cuWordLength + 1 + ((cuWordLength + 1U) / 3) * -3)
                                          - 1].cpLengths + 0x12),_rangeEnd_local);
              } while (UVar1 != '\0');
            }
            UVar1 = PossibleWord::backUp
                              ((PossibleWord *)
                               (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                               _rangeEnd_local);
          } while (UVar1 != '\0');
        }
LAB_0040ee21:
        status = PossibleWord::acceptMarked
                           ((PossibleWord *)
                            (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                            _rangeEnd_local);
        current = PossibleWord::markedCPLength
                            ((PossibleWord *)
                             (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12));
        cuWordLength = cuWordLength + 1;
      }
      iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
      if (((int)iVar5 < (int32_t)foundBreaks_local) && (current < 3)) {
        iVar4 = PossibleWord::candidates
                          ((PossibleWord *)
                           (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12),
                           _rangeEnd_local,this->fDictionary,(int32_t)foundBreaks_local);
        if ((iVar4 < 1) &&
           ((status == U_ZERO_ERROR ||
            (iVar4 = PossibleWord::longestPrefix
                               ((PossibleWord *)
                                (words[(ulong)((uint)cuWordLength % 3) - 1].cpLengths + 0x12)),
            iVar4 < 3)))) {
          uc = (int32_t)foundBreaks_local - (local_40 + status);
          pcSize = 0;
          do {
            do {
              iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
              UVar2 = utext_next32_63(_rangeEnd_local);
              iVar6 = utext_getNativeIndex_63(_rangeEnd_local);
              iVar3 = (int)iVar6 - (int)iVar5;
              pcSize = iVar3 + pcSize;
              uc = uc - iVar3;
              if (uc < 1) goto LAB_0040f148;
              c = utext_current32_63(_rangeEnd_local);
              UVar1 = UnicodeSet::contains(&this->fEndWordSet,UVar2);
            } while ((UVar1 == '\0') ||
                    (UVar1 = UnicodeSet::contains(&this->fBeginWordSet,c), UVar1 == '\0'));
            iVar4 = PossibleWord::candidates
                              ((PossibleWord *)
                               (words[(ulong)(cuWordLength + 1 + ((cuWordLength + 1U) / 3) * -3) - 1
                                     ].cpLengths + 0x12),_rangeEnd_local,this->fDictionary,
                               (int32_t)foundBreaks_local);
            utext_setNativeIndex_63(_rangeEnd_local,(long)(local_40 + status + pcSize));
          } while (iVar4 < 1);
LAB_0040f148:
          if (status < U_ILLEGAL_ARGUMENT_ERROR) {
            cuWordLength = cuWordLength + 1;
          }
          status = pcSize + status;
        }
        else {
          utext_setNativeIndex_63(_rangeEnd_local,(long)(local_40 + status));
        }
      }
      while( true ) {
        iVar5 = utext_getNativeIndex_63(_rangeEnd_local);
        bVar7 = false;
        if ((int)iVar5 < (int32_t)foundBreaks_local) {
          UVar2 = utext_current32_63(_rangeEnd_local);
          UVar1 = UnicodeSet::contains(&this->fMarkSet,UVar2);
          bVar7 = UVar1 != '\0';
        }
        if (!bVar7) break;
        utext_next32_63(_rangeEnd_local);
        iVar6 = utext_getNativeIndex_63(_rangeEnd_local);
        status = ((int)iVar6 - (int)iVar5) + status;
      }
      if (U_ZERO_ERROR < status) {
        UVector32::push(_cpWordLength,local_40 + status,&local_44);
      }
    }
    iVar4 = UVector32::peeki(_cpWordLength);
    if ((int32_t)foundBreaks_local <= iVar4) {
      UVector32::popi(_cpWordLength);
      cuWordLength = cuWordLength + -1;
    }
    this_local._4_4_ = cuWordLength;
    local_3a0 = (PossibleWord *)(words[2].cpLengths + 0x12);
    do {
      local_3a0 = local_3a0 + -1;
      PossibleWord::~PossibleWord(local_3a0);
    } while (local_3a0 != (PossibleWord *)local_268);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
BurmeseBreakEngine::divideUpDictionaryRange( UText *text,
                                                int32_t rangeStart,
                                                int32_t rangeEnd,
                                                UVector32 &foundBreaks ) const {
    if ((rangeEnd - rangeStart) < BURMESE_MIN_WORD_SPAN) {
        return 0;       // Not enough characters for two words
    }

    uint32_t wordsFound = 0;
    int32_t cpWordLength = 0;
    int32_t cuWordLength = 0;
    int32_t current;
    UErrorCode status = U_ZERO_ERROR;
    PossibleWord words[BURMESE_LOOKAHEAD];
    
    utext_setNativeIndex(text, rangeStart);
    
    while (U_SUCCESS(status) && (current = (int32_t)utext_getNativeIndex(text)) < rangeEnd) {
        cuWordLength = 0;
        cpWordLength = 0;

        // Look for candidate words at the current position
        int32_t candidates = words[wordsFound%BURMESE_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
        
        // If we found exactly one, use that
        if (candidates == 1) {
            cuWordLength = words[wordsFound % BURMESE_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % BURMESE_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        // If there was more than one, see which one can take us forward the most words
        else if (candidates > 1) {
            // If we're already at the end of the range, we're done
            if (utext_getNativeIndex(text) >= rangeEnd) {
                goto foundBest;
            }
            do {
                int32_t wordsMatched = 1;
                if (words[(wordsFound + 1) % BURMESE_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) > 0) {
                    if (wordsMatched < 2) {
                        // Followed by another dictionary word; mark first word as a good candidate
                        words[wordsFound%BURMESE_LOOKAHEAD].markCurrent();
                        wordsMatched = 2;
                    }
                    
                    // If we're already at the end of the range, we're done
                    if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                        goto foundBest;
                    }
                    
                    // See if any of the possible second words is followed by a third word
                    do {
                        // If we find a third word, stop right away
                        if (words[(wordsFound + 2) % BURMESE_LOOKAHEAD].candidates(text, fDictionary, rangeEnd)) {
                            words[wordsFound % BURMESE_LOOKAHEAD].markCurrent();
                            goto foundBest;
                        }
                    }
                    while (words[(wordsFound + 1) % BURMESE_LOOKAHEAD].backUp(text));
                }
            }
            while (words[wordsFound % BURMESE_LOOKAHEAD].backUp(text));
foundBest:
            cuWordLength = words[wordsFound % BURMESE_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % BURMESE_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        
        // We come here after having either found a word or not. We look ahead to the
        // next word. If it's not a dictionary word, we will combine it withe the word we
        // just found (if there is one), but only if the preceding word does not exceed
        // the threshold.
        // The text iterator should now be positioned at the end of the word we found.
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && cpWordLength < BURMESE_ROOT_COMBINE_THRESHOLD) {
            // if it is a dictionary word, do nothing. If it isn't, then if there is
            // no preceding word, or the non-word shares less than the minimum threshold
            // of characters with a dictionary word, then scan to resynchronize
            if (words[wordsFound % BURMESE_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                  && (cuWordLength == 0
                      || words[wordsFound%BURMESE_LOOKAHEAD].longestPrefix() < BURMESE_PREFIX_COMBINE_THRESHOLD)) {
                // Look for a plausible word boundary
                int32_t remaining = rangeEnd - (current + cuWordLength);
                UChar32 pc;
                UChar32 uc;
                int32_t chars = 0;
                for (;;) {
                    int32_t pcIndex = (int32_t)utext_getNativeIndex(text);
                    pc = utext_next32(text);
                    int32_t pcSize = (int32_t)utext_getNativeIndex(text) - pcIndex;
                    chars += pcSize;
                    remaining -= pcSize;
                    if (remaining <= 0) {
                        break;
                    }
                    uc = utext_current32(text);
                    if (fEndWordSet.contains(pc) && fBeginWordSet.contains(uc)) {
                        // Maybe. See if it's in the dictionary.
                        // TODO: this looks iffy; compare with old code.
                        int32_t num_candidates = words[(wordsFound + 1) % BURMESE_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
                        utext_setNativeIndex(text, current + cuWordLength + chars);
                        if (num_candidates > 0) {
                            break;
                        }
                    }
                }
                
                // Bump the word count if there wasn't already one
                if (cuWordLength <= 0) {
                    wordsFound += 1;
                }
                
                // Update the length with the passed-over characters
                cuWordLength += chars;
            }
            else {
                // Back up to where we were for next iteration
                utext_setNativeIndex(text, current + cuWordLength);
            }
        }
        
        // Never stop before a combining mark.
        int32_t currPos;
        while ((currPos = (int32_t)utext_getNativeIndex(text)) < rangeEnd && fMarkSet.contains(utext_current32(text))) {
            utext_next32(text);
            cuWordLength += (int32_t)utext_getNativeIndex(text) - currPos;
        }
        
        // Look ahead for possible suffixes if a dictionary word does not follow.
        // We do this in code rather than using a rule so that the heuristic
        // resynch continues to function. For example, one of the suffix characters
        // could be a typo in the middle of a word.
        // NOT CURRENTLY APPLICABLE TO BURMESE

        // Did we find a word on this iteration? If so, push it on the break stack
        if (cuWordLength > 0) {
            foundBreaks.push((current+cuWordLength), status);
        }
    }

    // Don't return a break for the end of the dictionary range if there is one there.
    if (foundBreaks.peeki() >= rangeEnd) {
        (void) foundBreaks.popi();
        wordsFound -= 1;
    }

    return wordsFound;
}